

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageView::_q_currentIndexChanged(PageView *this,int index,int prev)

{
  PageViewPrivate *pPVar1;
  qsizetype qVar2;
  int prev_local;
  int index_local;
  PageView *this_local;
  
  if (-1 < prev) {
    pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    qVar2 = QList<QWidget_*>::count(&pPVar1->pages);
    if (prev < qVar2) {
      pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
               ::operator->(&this->d);
      QList<QWidget_*>::at(&pPVar1->pages,(long)prev);
      QWidget::hide();
    }
  }
  if (-1 < index) {
    pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    qVar2 = QList<QWidget_*>::count(&pPVar1->pages);
    if (index < qVar2) {
      pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
               ::operator->(&this->d);
      PageViewPrivate::showPage(pPVar1,index);
    }
  }
  return;
}

Assistant:

void
PageView::_q_currentIndexChanged( int index, int prev )
{
	if( prev >= 0 && prev < d->pages.count() )
		d->pages.at( prev )->hide();

	if( index >= 0 && index < d->pages.count() )
		d->showPage( index );
}